

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall pugi::xml_node::append_attribute(xml_node *this,char_t *name_)

{
  bool bVar1;
  xml_node_type parent;
  xml_allocator *this_00;
  xml_attribute_struct *attr;
  xml_attribute *in_RSI;
  xml_node *in_RDI;
  xml_attribute a;
  xml_allocator *alloc;
  xml_attribute in_stack_ffffffffffffffd8;
  xml_attribute local_8;
  
  parent = type(in_RDI);
  bVar1 = impl::anon_unknown_0::allow_insert_attribute(parent);
  if (bVar1) {
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(in_RDI->_root);
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar1) {
      attr = impl::anon_unknown_0::allocate_attribute(in_stack_ffffffffffffffd8._attr);
      xml_attribute::xml_attribute((xml_attribute *)&stack0xffffffffffffffd8,attr);
      bVar1 = xml_attribute::operator!((xml_attribute *)&stack0xffffffffffffffd8);
      if (bVar1) {
        xml_attribute::xml_attribute(&local_8);
      }
      else {
        impl::anon_unknown_0::append_attribute(in_stack_ffffffffffffffd8._attr,in_RDI->_root);
        xml_attribute::set_name(in_RSI,(char_t *)this_00);
        local_8._attr = in_stack_ffffffffffffffd8._attr;
      }
    }
    else {
      xml_attribute::xml_attribute(&local_8);
    }
  }
  else {
    xml_attribute::xml_attribute(&local_8);
  }
  return (xml_attribute)local_8._attr;
}

Assistant:

PUGI__FN xml_attribute xml_node::append_attribute(const char_t* name_)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::append_attribute(a._attr, _root);

		a.set_name(name_);

		return a;
	}